

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void convert_2u32s_C1R(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  
  for (uVar2 = 0; uVar2 < (length & 0xfffffffffffffffc); uVar2 = uVar2 + 4) {
    bVar1 = *pSrc;
    pSrc = pSrc + 1;
    pDst[uVar2] = (uint)(bVar1 >> 6);
    pDst[uVar2 + 1] = bVar1 >> 4 & 3;
    pDst[uVar2 + 2] = bVar1 >> 2 & 3;
    pDst[uVar2 + 3] = bVar1 & 3;
  }
  if ((length & 3) != 0) {
    bVar1 = *pSrc;
    pDst[uVar2] = (uint)(bVar1 >> 6);
    iVar3 = (int)(length & 3);
    if ((iVar3 != 1) && (pDst[uVar2 + 1] = bVar1 >> 4 & 3, iVar3 == 3)) {
      pDst[uVar2 + 2] = bVar1 >> 2 & 3;
    }
  }
  return;
}

Assistant:

static void convert_2u32s_C1R(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                              OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)3U); i += 4U) {
        OPJ_UINT32 val = *pSrc++;
        pDst[i + 0] = (OPJ_INT32)(val >> 6);
        pDst[i + 1] = (OPJ_INT32)((val >> 4) & 0x3U);
        pDst[i + 2] = (OPJ_INT32)((val >> 2) & 0x3U);
        pDst[i + 3] = (OPJ_INT32)(val & 0x3U);
    }
    if (length & 3U) {
        OPJ_UINT32 val = *pSrc++;
        length = length & 3U;
        pDst[i + 0] = (OPJ_INT32)(val >> 6);

        if (length > 1U) {
            pDst[i + 1] = (OPJ_INT32)((val >> 4) & 0x3U);
            if (length > 2U) {
                pDst[i + 2] = (OPJ_INT32)((val >> 2) & 0x3U);

            }
        }
    }
}